

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

undefined4 __thiscall despot::TagBlindBeliefPolicy::Value(TagBlindBeliefPolicy *this,Belief *belief)

{
  int iVar1;
  int iVar2;
  ACT_TYPE action;
  int iVar3;
  double dVar4;
  double local_38;
  undefined4 local_30 [4];
  
  local_38 = Globals::NEG_INFTY;
  iVar2 = -1;
  for (iVar3 = 0; iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x18))(), iVar3 < iVar1;
      iVar3 = iVar3 + 1) {
    dVar4 = (double)despot::MDP::ComputeActionValue
                              ((ParticleBelief *)this->tag_model_,(StateIndexer *)belief,
                               (int)this->tag_model_ + 0x40);
    iVar1 = iVar3;
    if (dVar4 <= local_38) {
      dVar4 = local_38;
      iVar1 = iVar2;
    }
    iVar2 = iVar1;
    local_38 = dVar4;
  }
  despot::ValuedAction::ValuedAction((ValuedAction *)local_30,iVar2,local_38);
  return local_30[0];
}

Assistant:

ValuedAction Value(const Belief* belief) const {
		double bestValue = Globals::NEG_INFTY;
		int bestAction = -1;
		for (ACT_TYPE action = 0; action < tag_model_->NumActions(); action++) {
			double value = tag_model_->ComputeActionValue(
				static_cast<const ParticleBelief*>(belief), *tag_model_,
				action);
			if (value > bestValue) {
				bestValue = value;
				bestAction = action;
			}
		}

		return ValuedAction(bestAction, bestValue);
	}